

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paramdict.cpp
# Opt level: O2

ParamDict * __thiscall ncnn::ParamDict::operator=(ParamDict *this,ParamDict *rhs)

{
  undefined8 *puVar1;
  int iVar2;
  ParamDictPrivate *pPVar3;
  ParamDictPrivate *pPVar4;
  int *piVar5;
  long *plVar6;
  undefined8 uVar7;
  undefined8 *puVar8;
  long lVar9;
  
  if (this != rhs) {
    for (lVar9 = 0; lVar9 != 0xa00; lVar9 = lVar9 + 0x50) {
      pPVar3 = rhs->d;
      iVar2 = *(int *)((long)&pPVar3->params[0].type + lVar9);
      pPVar4 = this->d;
      *(int *)((long)&pPVar4->params[0].type + lVar9) = iVar2;
      if (iVar2 - 1U < 3) {
        *(undefined4 *)((long)&pPVar4->params[0].field_1 + lVar9) =
             *(undefined4 *)((long)&pPVar3->params[0].field_1 + lVar9);
      }
      else if (pPVar4 != pPVar3) {
        piVar5 = *(int **)((long)&pPVar3->params[0].v.refcount + lVar9);
        if (piVar5 != (int *)0x0) {
          LOCK();
          *piVar5 = *piVar5 + 1;
          UNLOCK();
        }
        piVar5 = *(int **)((long)&pPVar4->params[0].v.refcount + lVar9);
        if (piVar5 != (int *)0x0) {
          LOCK();
          *piVar5 = *piVar5 + -1;
          UNLOCK();
          if (*piVar5 == 0) {
            plVar6 = *(long **)((long)&pPVar4->params[0].v.allocator + lVar9);
            if (plVar6 == (long *)0x0) {
              free(*(void **)((long)&pPVar4->params[0].v.data + lVar9));
            }
            else {
              (**(code **)(*plVar6 + 0x18))();
            }
          }
        }
        puVar8 = (undefined8 *)((long)&pPVar4->params[0].v.data + lVar9);
        *(undefined8 *)((long)&pPVar4->params[0].v.cstep + lVar9) = 0;
        *(undefined8 *)((long)&pPVar4->params[0].v.refcount + lVar9 + 4) = 0;
        *(undefined8 *)((long)&pPVar4->params[0].v.elemsize + lVar9 + 4) = 0;
        *puVar8 = 0;
        *(undefined8 *)((long)&pPVar4->params[0].v.refcount + lVar9) = 0;
        *(undefined4 *)((long)&pPVar4->params[0].v.c + lVar9) = 0;
        *(undefined8 *)((long)&pPVar4->params[0].v.dims + lVar9) = 0;
        *(undefined8 *)((long)&pPVar4->params[0].v.h + lVar9) = 0;
        puVar1 = (undefined8 *)((long)&pPVar3->params[0].v.data + lVar9);
        uVar7 = puVar1[1];
        *puVar8 = *puVar1;
        *(undefined8 *)((long)&pPVar4->params[0].v.refcount + lVar9) = uVar7;
        *(undefined8 *)((long)&pPVar4->params[0].v.elemsize + lVar9) =
             *(undefined8 *)((long)&pPVar3->params[0].v.elemsize + lVar9);
        *(undefined4 *)((long)&pPVar4->params[0].v.elempack + lVar9) =
             *(undefined4 *)((long)&pPVar3->params[0].v.elempack + lVar9);
        *(undefined8 *)((long)&pPVar4->params[0].v.allocator + lVar9) =
             *(undefined8 *)((long)&pPVar3->params[0].v.allocator + lVar9);
        puVar1 = (undefined8 *)((long)&pPVar3->params[0].v.dims + lVar9);
        uVar7 = puVar1[1];
        *(undefined8 *)((long)&pPVar4->params[0].v.dims + lVar9) = *puVar1;
        *(undefined8 *)((long)&pPVar4->params[0].v.h + lVar9) = uVar7;
        *(undefined4 *)((long)&pPVar4->params[0].v.c + lVar9) =
             *(undefined4 *)((long)&pPVar3->params[0].v.c + lVar9);
        *(undefined8 *)((long)&pPVar4->params[0].v.cstep + lVar9) =
             *(undefined8 *)((long)&pPVar3->params[0].v.cstep + lVar9);
      }
    }
  }
  return this;
}

Assistant:

ParamDict& ParamDict::operator=(const ParamDict& rhs)
{
    if (this == &rhs)
        return *this;

    for (int i = 0; i < NCNN_MAX_PARAM_COUNT; i++)
    {
        int type = rhs.d->params[i].type;
        d->params[i].type = type;
        if (type == 1 || type == 2 || type == 3)
        {
            d->params[i].i = rhs.d->params[i].i;
        }
        else // if (type == 4 || type == 5 || type == 6)
        {
            d->params[i].v = rhs.d->params[i].v;
        }
    }

    return *this;
}